

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# real-time-logger-def.h
# Opt level: O0

void __thiscall dynamicgraph::RTLoggerStream::~RTLoggerStream(RTLoggerStream *this)

{
  RTLoggerStream *this_local;
  
  if ((this->ok_ & 1U) != 0) {
    std::ostream::operator<<(this->os_,std::ends<char,std::char_traits<char>>);
    RealTimeLogger::frontReady(this->logger_);
  }
  return;
}

Assistant:

RTLoggerStream::~RTLoggerStream() {
  if (ok_) {
    os_ << std::ends;
    logger_->frontReady();
  }
}